

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenize.cpp
# Opt level: O0

vector<skiwi::token,_std::allocator<skiwi::token>_> *
skiwi::tokenize(vector<skiwi::token,_std::allocator<skiwi::token>_> *__return_storage_ptr__,
               string *str)

{
  char *pcVar1;
  bool bVar2;
  long lVar3;
  long lVar4;
  ulong uVar5;
  char *pcVar6;
  char *pcVar7;
  bool local_1a1;
  allocator<char> local_139;
  string local_138;
  string local_118;
  e_type local_f8;
  allocator<char> local_f1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  e_type local_cc;
  char *local_c8;
  char *t_2;
  int temp_line_nr;
  int temp_column_nr;
  char *local_b0;
  char *t_1;
  e_type local_a0;
  byte local_99;
  char *pcStack_98;
  bool end_of_comment_found;
  char *t;
  e_type local_88 [4];
  char *local_78;
  char *s_copy;
  int local_5c;
  int local_58;
  int column_nr;
  int line_nr;
  bool is_a_character;
  bool is_a_symbol;
  char *s_end;
  char *s;
  string buff;
  string *str_local;
  vector<skiwi::token,_std::allocator<skiwi::token>_> *tokens;
  
  buff.field_2._M_local_buf[0xf] = '\0';
  std::vector<skiwi::token,_std::allocator<skiwi::token>_>::vector(__return_storage_ptr__);
  std::__cxx11::string::string((string *)&s);
  s_end = (char *)std::__cxx11::string::c_str();
  lVar3 = std::__cxx11::string::c_str();
  lVar4 = std::__cxx11::string::length();
  _line_nr = (char *)(lVar3 + lVar4);
  column_nr._3_1_ = 0;
  column_nr._2_1_ = false;
  local_58 = 1;
  local_5c = 1;
  do {
    if (_line_nr <= s_end) {
      anon_unknown_4::_treat_buffer
                ((string *)&s,__return_storage_ptr__,local_58,local_5c,
                 (bool *)((long)&column_nr + 3));
      buff.field_2._M_local_buf[0xf] = '\x01';
      std::__cxx11::string::~string((string *)&s);
      if ((buff.field_2._M_local_buf[0xf] & 1U) == 0) {
        std::vector<skiwi::token,_std::allocator<skiwi::token>_>::~vector(__return_storage_ptr__);
      }
      return __return_storage_ptr__;
    }
    bVar2 = anon_unknown_4::ignore_character(s_end);
    if (bVar2) {
      anon_unknown_4::_treat_buffer
                ((string *)&s,__return_storage_ptr__,local_58,local_5c,
                 (bool *)((long)&column_nr + 3));
      column_nr._2_1_ = 0;
      while (bVar2 = anon_unknown_4::ignore_character(s_end), bVar2) {
        if (*s_end == '\n') {
          local_58 = local_58 + 1;
          local_5c = 0;
        }
        s_end = s_end + 1;
        local_5c = local_5c + 1;
      }
    }
    local_78 = s_end;
    if ((column_nr._2_1_ & 1) == 0) {
      switch(*s_end) {
      case '\"':
        anon_unknown_4::_treat_buffer
                  ((string *)&s,__return_storage_ptr__,local_58,local_5c,
                   (bool *)((long)&column_nr + 3));
        pcVar6 = s_end;
        t_2._4_4_ = local_5c;
        t_2._0_4_ = local_58;
        pcVar7 = s_end;
        do {
          pcVar1 = pcVar7;
          local_5c = local_5c + 1;
          local_c8 = pcVar1 + 1;
          bVar2 = false;
          if (*local_c8 != '\0') {
            bVar2 = *local_c8 != '\"';
          }
          if (!bVar2) goto LAB_004dcf23;
          if (*local_c8 == '\n') {
            local_58 = local_58 + 1;
            local_5c = 0;
          }
          pcVar7 = local_c8;
        } while ((*local_c8 != '\\') || (pcVar7 = pcVar1 + 2, *pcVar7 != '\0'));
        local_cc = T_BAD;
        local_c8 = pcVar7;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<char_const*,void>((string *)&local_f0,pcVar6,pcVar7,&local_f1);
        std::vector<skiwi::token,std::allocator<skiwi::token>>::
        emplace_back<skiwi::token::e_type,std::__cxx11::string,int&,int&>
                  ((vector<skiwi::token,std::allocator<skiwi::token>> *)__return_storage_ptr__,
                   &local_cc,&local_f0,(int *)&t_2,(int *)((long)&t_2 + 4));
        std::__cxx11::string::~string((string *)&local_f0);
        std::allocator<char>::~allocator(&local_f1);
LAB_004dcf23:
        pcVar6 = s_end;
        if (*local_c8 != '\0') {
          local_c8 = local_c8 + 1;
          local_5c = local_5c + 1;
        }
        pcVar7 = local_c8;
        local_f8 = T_STRING;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<char_const*,void>
                  ((string *)&local_138,pcVar6,pcVar7,&local_139);
        anon_unknown_4::replace_escape_chars(&local_118,&local_138);
        std::vector<skiwi::token,std::allocator<skiwi::token>>::
        emplace_back<skiwi::token::e_type,std::__cxx11::string,int&,int&>
                  ((vector<skiwi::token,std::allocator<skiwi::token>> *)__return_storage_ptr__,
                   &local_f8,&local_118,(int *)&t_2,(int *)((long)&t_2 + 4));
        std::__cxx11::string::~string((string *)&local_118);
        std::__cxx11::string::~string((string *)&local_138);
        std::allocator<char>::~allocator(&local_139);
        s_end = local_c8;
        break;
      case '#':
        if ((column_nr._3_1_ & 1) == 0) {
          anon_unknown_4::_treat_buffer
                    ((string *)&s,__return_storage_ptr__,local_58,local_5c,
                     (bool *)((long)&column_nr + 3));
          pcStack_98 = s_end + 1;
          if ((pcStack_98 == (char *)0x0) || (*pcStack_98 != ';')) {
            if ((pcStack_98 == (char *)0x0) || (*pcStack_98 != '|')) {
              column_nr._3_1_ = 1;
            }
            else {
              local_5c = local_5c + 1;
              local_99 = 0;
              s_end = s_end + 2;
              while (((local_99 ^ 0xff) & 1) != 0) {
                while( true ) {
                  bVar2 = false;
                  if (*s_end != '\0') {
                    bVar2 = *s_end != '|';
                  }
                  if (!bVar2) break;
                  if (*s_end == '\n') {
                    local_58 = local_58 + 1;
                    local_5c = 0;
                  }
                  s_end = s_end + 1;
                  local_5c = local_5c + 1;
                }
                if ((*s_end == '\0') ||
                   (pcVar7 = s_end + 1, pcVar6 = s_end + 1, s_end = pcVar7, *pcVar6 == '#')) {
                  local_99 = 1;
                }
              }
            }
            local_5c = local_5c + 1;
          }
          else {
            while( true ) {
              bVar2 = false;
              if (*s_end != '\0') {
                bVar2 = *s_end != '\n';
              }
              if (!bVar2) break;
              s_end = s_end + 1;
            }
            local_58 = local_58 + 1;
            local_5c = 1;
          }
          s_end = s_end + 1;
        }
        break;
      case '\'':
        anon_unknown_4::_treat_buffer
                  ((string *)&s,__return_storage_ptr__,local_58,local_5c,
                   (bool *)((long)&column_nr + 3));
        local_a0 = T_QUOTE;
        std::vector<skiwi::token,std::allocator<skiwi::token>>::
        emplace_back<skiwi::token::e_type,char_const(&)[2],int&,int&>
                  ((vector<skiwi::token,std::allocator<skiwi::token>> *)__return_storage_ptr__,
                   &local_a0,(char (*) [2])"\'",&local_58,&local_5c);
        s_end = s_end + 1;
        local_5c = local_5c + 1;
        break;
      case '(':
        if (((column_nr._3_1_ & 1) == 0) ||
           (uVar5 = std::__cxx11::string::empty(), (uVar5 & 1) == 0)) {
          anon_unknown_4::_treat_buffer
                    ((string *)&s,__return_storage_ptr__,local_58,local_5c,
                     (bool *)((long)&column_nr + 3));
          local_88[2] = 5;
          std::vector<skiwi::token,std::allocator<skiwi::token>>::
          emplace_back<skiwi::token::e_type,char_const(&)[2],int&,int&>
                    ((vector<skiwi::token,std::allocator<skiwi::token>> *)__return_storage_ptr__,
                     local_88 + 2,(char (*) [2])0x4e6cf8,&local_58,&local_5c);
          s_end = s_end + 1;
          local_5c = local_5c + 1;
        }
        else {
          column_nr._3_1_ = 0;
          local_88[3] = 5;
          std::vector<skiwi::token,std::allocator<skiwi::token>>::
          emplace_back<skiwi::token::e_type,char_const(&)[3],int&,int&>
                    ((vector<skiwi::token,std::allocator<skiwi::token>> *)__return_storage_ptr__,
                     local_88 + 3,(char (*) [3])"#(",&local_58,&local_5c);
          s_end = s_end + 1;
          local_5c = local_5c + 1;
        }
        break;
      case ')':
        anon_unknown_4::_treat_buffer
                  ((string *)&s,__return_storage_ptr__,local_58,local_5c,
                   (bool *)((long)&column_nr + 3));
        local_88[1] = 6;
        std::vector<skiwi::token,std::allocator<skiwi::token>>::
        emplace_back<skiwi::token::e_type,char_const(&)[2],int&,int&>
                  ((vector<skiwi::token,std::allocator<skiwi::token>> *)__return_storage_ptr__,
                   local_88 + 1,(char (*) [2])0x4e47a0,&local_58,&local_5c);
        s_end = s_end + 1;
        local_5c = local_5c + 1;
        break;
      case ',':
        anon_unknown_4::_treat_buffer
                  ((string *)&s,__return_storage_ptr__,local_58,local_5c,
                   (bool *)((long)&column_nr + 3));
        local_b0 = s_end + 1;
        if ((*local_b0 == '\0') || (*local_b0 != '@')) {
          temp_line_nr = 3;
          std::vector<skiwi::token,std::allocator<skiwi::token>>::
          emplace_back<skiwi::token::e_type,char_const(&)[2],int&,int&>
                    ((vector<skiwi::token,std::allocator<skiwi::token>> *)__return_storage_ptr__,
                     (e_type *)&temp_line_nr,(char (*) [2])",",&local_58,&local_5c);
        }
        else {
          temp_column_nr = 4;
          std::vector<skiwi::token,std::allocator<skiwi::token>>::
          emplace_back<skiwi::token::e_type,char_const(&)[3],int&,int&>
                    ((vector<skiwi::token,std::allocator<skiwi::token>> *)__return_storage_ptr__,
                     (e_type *)&temp_column_nr,(char (*) [3])",@",&local_58,&local_5c);
          s_end = s_end + 1;
          local_5c = local_5c + 1;
        }
        s_end = s_end + 1;
        local_5c = local_5c + 1;
        break;
      case ';':
        anon_unknown_4::_treat_buffer
                  ((string *)&s,__return_storage_ptr__,local_58,local_5c,
                   (bool *)((long)&column_nr + 3));
        while( true ) {
          bVar2 = false;
          if (*s_end != '\0') {
            bVar2 = *s_end != '\n';
          }
          if (!bVar2) break;
          s_end = s_end + 1;
        }
        s_end = s_end + 1;
        local_58 = local_58 + 1;
        local_5c = 1;
        break;
      case '[':
        anon_unknown_4::_treat_buffer
                  ((string *)&s,__return_storage_ptr__,local_58,local_5c,
                   (bool *)((long)&column_nr + 3));
        local_88[0] = T_LEFT_SQUARE_BRACKET;
        std::vector<skiwi::token,std::allocator<skiwi::token>>::
        emplace_back<skiwi::token::e_type,char_const(&)[2],int&,int&>
                  ((vector<skiwi::token,std::allocator<skiwi::token>> *)__return_storage_ptr__,
                   local_88,(char (*) [2])"[",&local_58,&local_5c);
        s_end = s_end + 1;
        local_5c = local_5c + 1;
        break;
      case ']':
        anon_unknown_4::_treat_buffer
                  ((string *)&s,__return_storage_ptr__,local_58,local_5c,
                   (bool *)((long)&column_nr + 3));
        t._4_4_ = 8;
        std::vector<skiwi::token,std::allocator<skiwi::token>>::
        emplace_back<skiwi::token::e_type,char_const(&)[2],int&,int&>
                  ((vector<skiwi::token,std::allocator<skiwi::token>> *)__return_storage_ptr__,
                   (e_type *)((long)&t + 4),(char (*) [2])0x4e4175,&local_58,&local_5c);
        s_end = s_end + 1;
        local_5c = local_5c + 1;
        break;
      case '`':
        anon_unknown_4::_treat_buffer
                  ((string *)&s,__return_storage_ptr__,local_58,local_5c,
                   (bool *)((long)&column_nr + 3));
        t_1._4_4_ = 2;
        std::vector<skiwi::token,std::allocator<skiwi::token>>::
        emplace_back<skiwi::token::e_type,char_const(&)[2],int&,int&>
                  ((vector<skiwi::token,std::allocator<skiwi::token>> *)__return_storage_ptr__,
                   (e_type *)((long)&t_1 + 4),(char (*) [2])"`",&local_58,&local_5c);
        s_end = s_end + 1;
        local_5c = local_5c + 1;
      }
    }
    if (local_78 == s_end) {
      std::__cxx11::string::operator+=((string *)&s,*s_end);
      s_end = s_end + 1;
      local_5c = local_5c + 1;
    }
    local_1a1 = false;
    if ((column_nr._3_1_ & 1) != 0) {
      lVar3 = std::__cxx11::string::size();
      local_1a1 = false;
      if (lVar3 == 1) {
        pcVar6 = (char *)std::__cxx11::string::operator[]((ulong)&s);
        local_1a1 = *pcVar6 == '\\';
      }
    }
    column_nr._2_1_ = local_1a1;
  } while( true );
}

Assistant:

std::vector<token> tokenize(const std::string& str)
  {
  std::vector<token> tokens;
  std::string buff;

  const char* s = str.c_str();
  const char* s_end = str.c_str() + str.length();

  bool is_a_symbol = false;
  bool is_a_character = false;

  int line_nr = 1;
  int column_nr = 1;

  while (s < s_end)
    {
    //if (*s == ' ' || *s == '\n')
    if (ignore_character(*s))
      {
      _treat_buffer(buff, tokens, line_nr, column_nr, is_a_symbol);
      is_a_character = false;
      //while (*s == ' ' || *s == '\n')
      while (ignore_character(*s))
        {
        if (*s == '\n')
          {
          ++line_nr;
          column_nr = 0;
          }
        ++s;
        ++column_nr;
        }
      }

    const char* s_copy = s;
    if (!is_a_character) // any special sign can appear as a character, e.g. #\(
      {
      switch (*s)
        {
        case '(':
        {
        if (is_a_symbol && buff.empty()) // #(
          {
          is_a_symbol = false;
          tokens.emplace_back(token::T_LEFT_ROUND_BRACKET, "#(", line_nr, column_nr);
          ++s;
          ++column_nr;
          break;
          }
        _treat_buffer(buff, tokens, line_nr, column_nr, is_a_symbol);
        tokens.emplace_back(token::T_LEFT_ROUND_BRACKET, "(", line_nr, column_nr);
        ++s;
        ++column_nr;
        break;
        }
        case ')':
        {
        _treat_buffer(buff, tokens, line_nr, column_nr, is_a_symbol);
        tokens.emplace_back(token::T_RIGHT_ROUND_BRACKET, ")", line_nr, column_nr);
        ++s;
        ++column_nr;
        break;
        }
        case '[':
        {
        _treat_buffer(buff, tokens, line_nr, column_nr, is_a_symbol);
        tokens.emplace_back(token::T_LEFT_SQUARE_BRACKET, "[", line_nr, column_nr);
        ++s;
        ++column_nr;
        break;
        }
        case ']':
        {
        _treat_buffer(buff, tokens, line_nr, column_nr, is_a_symbol);
        tokens.emplace_back(token::T_RIGHT_SQUARE_BRACKET, "]", line_nr, column_nr);
        ++s;
        ++column_nr;
        break;
        }
        case '#':
        {
        if (is_a_symbol)
          break;
        _treat_buffer(buff, tokens, line_nr, column_nr, is_a_symbol);
        const char* t = s;
        ++t;
        if (t && *t == ';') //treat as comment
          {
          while (*s && *s != '\n') // comment, so skip till end of the line
            ++s;
          ++s;
          ++line_nr;
          column_nr = 1;
          }
        else if (t && *t == '|') //treat as multiline comment
          {
          s = t;
          ++s; ++column_nr;
          bool end_of_comment_found = false;
          while (!end_of_comment_found)
            {
            while (*s && *s != '|')
              {
              if (*s == '\n')
                {
                ++line_nr;
                column_nr = 0;
                }
              ++s;
              ++column_nr;
              }
            if (!(*s) || (*(++s) == '#'))
              end_of_comment_found = true;
            }
          ++s; ++column_nr;
          }
        else
          {
          is_a_symbol = true;
          ++s;
          ++column_nr;
          }
        break;
        }
        case ';':
        {
        _treat_buffer(buff, tokens, line_nr, column_nr, is_a_symbol);
        while (*s && *s != '\n') // comment, so skip till end of the line
          ++s;
        ++s;
        ++line_nr;
        column_nr = 1;
        break;
        }
        case '\'':
        {
        _treat_buffer(buff, tokens, line_nr, column_nr, is_a_symbol);
        tokens.emplace_back(token::T_QUOTE, "'", line_nr, column_nr);
        ++s;
        ++column_nr;
        break;
        }
        case '`':
        {
        _treat_buffer(buff, tokens, line_nr, column_nr, is_a_symbol);
        tokens.emplace_back(token::T_BACKQUOTE, "`", line_nr, column_nr);
        ++s;
        ++column_nr;
        break;
        }
        case ',':
        {
        _treat_buffer(buff, tokens, line_nr, column_nr, is_a_symbol);
        const char* t = s;
        ++t;
        if (*t && *t == '@')
          {
          tokens.emplace_back(token::T_UNQUOTE_SPLICING, ",@", line_nr, column_nr);
          ++s;
          ++column_nr;
          }
        else
          {
          tokens.emplace_back(token::T_UNQUOTE, ",", line_nr, column_nr);
          }
        ++s;
        ++column_nr;
        break;
        }
        case '"':
        {
        _treat_buffer(buff, tokens, line_nr, column_nr, is_a_symbol);
        int temp_column_nr = column_nr;
        int temp_line_nr = line_nr;
        const char* t = s;
        ++t;
        ++column_nr;
        while (*t && *t != '"')
          {
          if (*t == '\n')
            {
            ++line_nr;
            column_nr = 0;
            }
          if (*t == '\\') // escape syntax
            {
            ++t;
            if (!*t)
              {
              tokens.emplace_back(token::T_BAD, std::string(s, t), temp_line_nr, temp_column_nr);
              break;
              }
            }
          ++t;
          ++column_nr;
          }
        if (*t)
          {
          ++t;
          ++column_nr;
          }
        tokens.emplace_back(token::T_STRING, replace_escape_chars(std::string(s, t)), temp_line_nr, temp_column_nr);
        s = t;
        break;
        }
        }
      }

    if (s_copy == s)
      {
      buff += *s;
      ++s;
      ++column_nr;
      }

    is_a_character = (is_a_symbol && buff.size() == 1 && buff[0] == '\\');
    }

  _treat_buffer(buff, tokens, line_nr, column_nr, is_a_symbol);

  return tokens;
  }